

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbmradix.c
# Opt level: O3

void rsorta(string *a,int n,int b)

{
  string *ppuVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int b_00;
  string puVar4;
  string puVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  string *a_00;
  long lVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  string *ppuVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  int *piVar22;
  int *piVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  undefined1 auVar27 [16];
  mbmstack_t stmp;
  string *pile [256];
  mbmstack_t stack [1024];
  string *local_4838 [254];
  undefined8 uStack_4048;
  int aiStack_4040 [2];
  string *local_4038;
  int local_4030 [4096];
  
  local_4038 = a;
  local_4030[0] = n;
  local_4030[1] = b;
  lVar13 = 0x10;
  do {
    lVar15 = lVar13 + -0x10;
    a_00 = *(string **)((long)&uStack_4048 + lVar13);
    iVar10 = *(int *)((long)aiStack_4040 + lVar13);
    lVar16 = (long)iVar10;
    b_00 = *(int *)((long)aiStack_4040 + lVar13 + 4);
    if (lVar16 < 10) {
      lVar13 = lVar15;
      if (1 < iVar10) {
        lVar24 = 1;
        lVar26 = 2;
        lVar14 = lVar26;
LAB_001ddef0:
        do {
          iVar10 = scmp(a_00[lVar26 + -2] + b_00,a_00[lVar26 + -1] + b_00);
          if (0 < iVar10) {
            auVar2 = *(undefined1 (*) [16])(a_00 + lVar26 + -2);
            auVar27._0_8_ = auVar2._8_8_;
            auVar27._8_4_ = auVar2._0_4_;
            auVar27._12_4_ = auVar2._4_4_;
            *(undefined1 (*) [16])(a_00 + lVar26 + -2) = auVar27;
            lVar26 = lVar26 + -1;
            if (1 < lVar26) goto LAB_001ddef0;
          }
          lVar24 = lVar24 + 1;
          lVar26 = lVar14 + 1;
          lVar14 = lVar26;
        } while (lVar24 != lVar16);
      }
    }
    else {
      ppuVar1 = a_00 + lVar16;
      iVar11 = rsorta::nc;
      if (rsorta::nc == 0) {
        rsorta::cmin = 0xff;
        iVar11 = 0;
        uVar18 = 0xff;
        ppuVar19 = a_00;
        do {
          bVar3 = (*ppuVar19)[b_00];
          iVar25 = rsorta::count[bVar3];
          rsorta::count[bVar3] = iVar25 + 1;
          if (iVar25 == 0 && bVar3 != 0) {
            uVar20 = (uint)bVar3;
            if (uVar20 < uVar18) {
              uVar18 = uVar20;
              rsorta::cmin = uVar20;
            }
            iVar11 = iVar11 + 1;
            rsorta::nc = iVar11;
          }
          ppuVar19 = ppuVar19 + 1;
        } while (ppuVar19 < ppuVar1);
        if (0x4000 < (long)iVar11 * 0x10 + lVar15) {
          rsorta(a_00,iVar10,b_00);
          lVar13 = lVar15;
          goto LAB_001ddfd3;
        }
      }
      pauVar21 = (undefined1 (*) [16])((long)&uStack_4048 + lVar13);
      ppuVar19 = a_00 + rsorta::count[0];
      local_4838[0] = ppuVar19;
      pauVar17 = pauVar21;
      if (iVar11 < 1) {
        lVar16 = 0;
      }
      else {
        piVar22 = rsorta::count + (uint)rsorta::cmin;
        iVar10 = 2;
        lVar14 = lVar15;
        do {
          lVar16 = (long)piVar22 * 0x40000000 + -0x2f98a100000000;
          do {
            piVar23 = piVar22;
            lVar16 = lVar16 + 0x100000000;
            iVar25 = *piVar23;
            piVar22 = piVar23 + 1;
          } while (iVar25 == 0);
          lVar15 = lVar14;
          if (1 < iVar25) {
            if (iVar10 < iVar25) {
              iVar10 = iVar25;
              pauVar17 = (undefined1 (*) [16])((long)&local_4038 + lVar14);
            }
            *(string **)*(undefined1 (*) [16])((long)&local_4038 + lVar14) = ppuVar19;
            *(int *)((long)local_4030 + lVar14) = iVar25;
            lVar15 = lVar14 + 0x10;
            *(int *)((long)local_4030 + lVar14 + 4) = b_00 + 1;
            iVar25 = *piVar23;
          }
          ppuVar19 = ppuVar19 + iVar25;
          lVar16 = lVar16 >> 0x20;
          local_4838[lVar16] = ppuVar19;
          bVar6 = 1 < iVar11;
          lVar14 = lVar15;
          iVar11 = iVar11 + -1;
        } while (bVar6);
        rsorta::nc = 0;
      }
      uVar7 = *(undefined8 *)*pauVar21;
      uVar8 = *(undefined8 *)((long)aiStack_4040 + lVar13);
      uVar9 = *(undefined8 *)(*pauVar17 + 8);
      *(undefined8 *)*pauVar21 = *(undefined8 *)*pauVar17;
      *(undefined8 *)((long)aiStack_4040 + lVar13) = uVar9;
      auVar2._8_8_ = uVar8;
      auVar2._0_8_ = uVar7;
      *pauVar17 = auVar2;
      iVar10 = rsorta::count[lVar16];
      rsorta::count[lVar16] = 0;
      for (; lVar13 = lVar15, a_00 < ppuVar1 + -(long)iVar10; a_00 = a_00 + iVar11) {
        puVar4 = *a_00;
        uVar12 = (ulong)puVar4[b_00];
        ppuVar19 = local_4838[uVar12] + -1;
        local_4838[uVar12] = ppuVar19;
        while (a_00 < ppuVar19) {
          puVar5 = *ppuVar19;
          *ppuVar19 = puVar4;
          uVar12 = (ulong)puVar5[b_00];
          ppuVar19 = local_4838[uVar12] + -1;
          local_4838[uVar12] = ppuVar19;
          puVar4 = puVar5;
        }
        *a_00 = puVar4;
        iVar11 = rsorta::count[uVar12];
        rsorta::count[uVar12] = 0;
      }
    }
LAB_001ddfd3:
    if (lVar13 < 1) {
      return;
    }
  } while( true );
}

Assistant:

static void rsorta(string *a, int n, int b)
{
#define push(a, n, i)   sp->sa = a, sp->sn = n, (sp++)->si = i
#define pop(a, n, i)    a = (--sp)->sa, n = sp->sn, i = sp->si
#define stackempty()    (sp <= stack)
#define swap(p, q, r)   r = p, p = q, q = r
        mbmstack_t      stack[SIZE], *sp = stack, stmp, *oldsp, *bigsp;
        string          *pile[256], *ak, *an, r, t;
        static int      count[256], cmin, nc;
        int             *cp, c, cmax;

        push(a, n, b);

        while(!stackempty()) {
                pop(a, n, b);
                if(n < THRESHOLD) {
                        simplesort(a, n, b);
                        continue;
                }
                an = a + n;
                if(nc == 0) {                       /* untallied? */
                        cmin = 255;                 /* tally */
                        for(ak = a; ak < an; ) {
                                c = (*ak++)[b];
                                if(++count[c] == 1 && c > 0) {
                                        if(c < cmin) cmin = c;
                                        nc++;
                                }
                        }
                        if(sp+nc > stack+SIZE) {     /* stack overflow */
                                  rsorta(a, n, b);
                                  continue;
                        }
                }
                oldsp = bigsp = sp, c = 2;         /* logartihmic stack */
                pile[0] = ak = a+count[cmax=0];    /* find places */
                for(cp = count+cmin; nc > 0; cp++, nc--) {
                         while(*cp == 0) cp++;
                         if (*cp > 1) {
                                  if(*cp > c) c = *cp, bigsp = sp;
                                  push(ak, *cp, b+1);
                         }
                         pile[cmax = cp-count] = ak += *cp;
                }
                swap(*oldsp, *bigsp, stmp);
                an -= count[cmax];                 /* permute home */
                count[cmax] = 0;
                for(ak = a; ak < an; ak += count[c], count[c] = 0) {
                        r = *ak;
                        while(--pile[c = r[b]] > ak)
                                swap(*pile[c], r, t);
                        *ak = r;
                                /* here nc = count[...] = 0 */
                }
        }
}